

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_reference.cpp
# Opt level: O2

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true> __thiscall
duckdb::ExpressionExecutor::InitializeState
          (ExpressionExecutor *this,BoundReferenceExpression *expr,ExpressionExecutorState *root)

{
  pointer this_00;
  
  make_uniq<duckdb::ExpressionState,duckdb::BoundReferenceExpression_const&,duckdb::ExpressionExecutorState&>
            ((duckdb *)this,expr,root);
  this_00 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
            ::operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
                          *)this);
  ExpressionState::Finalize(this_00);
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)this;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundReferenceExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<ExpressionState>(expr, root);
	result->Finalize();
	return result;
}